

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O2

int space_mixer_free(mixed_segment *segment)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)segment->data;
  if (puVar1 != (undefined8 *)0x0) {
    free_fft_window_data((fft_window_data *)(puVar1 + 0xa8a));
    if ((void *)puVar1[2] != (void *)0x0) {
      (*mixed_free)((void *)puVar1[2]);
      puVar1[2] = 0;
    }
    if ((void *)*puVar1 != (void *)0x0) {
      (*mixed_free)((void *)*puVar1);
      *puVar1 = 0;
    }
    (*mixed_free)(puVar1);
  }
  segment->data = (void *)0x0;
  return 1;
}

Assistant:

int space_mixer_free(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  if(data){
    free_fft_window_data(&data->fft_window_data);
    FREE(data->out);
    FREE(data->sources);
    mixed_free(data);
  }
  segment->data = 0;
  return 1;
}